

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float fVar5;
  float fVar6;
  int *piVar7;
  int iVar8;
  int m;
  long lVar9;
  uint _c;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  Mat *pMVar13;
  int kk;
  ulong uVar14;
  float *pfVar15;
  int iVar16;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  uint local_120;
  undefined8 local_110;
  undefined1 local_108 [12];
  float fStack_fc;
  size_t local_f8;
  float local_f0 [2];
  undefined8 local_e8;
  int local_e0;
  int local_dc;
  float local_d8 [4];
  size_t local_c8;
  ulong local_b8;
  ulong local_b0;
  Mat *local_a8;
  ulong local_a0;
  Mat *local_98;
  ulong local_90;
  uint local_84;
  int local_80;
  uint local_7c;
  Mat local_78;
  
  uVar12 = (ulong)(uint)inch;
  local_a8 = kernel;
  get_optimal_tile_mnk(outch,0,inch,(int *)&local_7c,&local_80,(int *)&local_84,opt->num_threads);
  local_b8 = (ulong)local_7c;
  _c = (int)(local_7c + outch + -1) / (int)local_7c;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_b0 = (ulong)(uint)outch;
  Mat::create(&local_78,local_84 * local_7c * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
  local_98 = AT;
  Mat::create(AT,local_84 * local_7c,0x24,(int)(inch + local_84 + -1) / (int)local_84,_c,4,
              (Allocator *)0x0);
  if (0 < (int)_c) {
    local_120 = 0;
    local_a0 = uVar12;
    do {
      iVar8 = get_omp_thread_num();
      if (0 < (int)uVar12) {
        local_110 = (Mat *)((long)iVar8 * local_78.cstep *
                            CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                           (long)local_78.data);
        iVar8 = (int)local_b8 * local_120;
        uVar10 = (int)local_b0 - iVar8;
        uVar11 = (ulong)uVar10;
        if ((int)local_b8 < (int)uVar10) {
          uVar11 = local_b8 & 0xffffffff;
        }
        local_90 = (ulong)local_120;
        iVar16 = 0;
        do {
          uVar10 = (int)uVar12 - iVar16;
          if ((int)local_84 < (int)uVar10) {
            uVar10 = local_84;
          }
          if (0 < (int)uVar11) {
            pvVar4 = local_a8->data;
            uVar12 = 0;
            pMVar13 = local_110;
            do {
              if (0 < (int)uVar10) {
                uVar14 = 0;
                do {
                  pfVar15 = (float *)((long)pvVar4 +
                                     (uVar14 + (long)iVar16) * 0x24 +
                                     (long)(((int)uVar12 + iVar8) * inch * 9) * 4);
                  lVar9 = 0;
                  do {
                    fVar1 = *pfVar15;
                    fVar2 = pfVar15[1];
                    fVar3 = pfVar15[2];
                    *(float *)(local_108 + lVar9 * 4) = fVar1;
                    fVar5 = fVar2 * 0.47140452;
                    fVar6 = fVar3 * 0.33333334;
                    (&fStack_fc)[lVar9] = fVar1 * -0.6666667 - (fVar5 + fVar6);
                    local_f0[lVar9] = (fVar5 + fVar1 * -0.6666667) - fVar6;
                    fVar2 = fVar2 * 0.23570226;
                    *(float *)((long)&local_e8 + lVar9 * 4 + 4) = fVar2 + fVar1 * 0.16666667 + fVar6
                    ;
                    local_d8[lVar9] = (fVar1 * 0.16666667 - fVar2) + fVar6;
                    local_d8[lVar9 + 3] = fVar3;
                    pfVar15 = pfVar15 + 3;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  lVar9 = 8;
                  do {
                    fVar1 = *(float *)((long)&local_110 + lVar9);
                    fVar2 = *(float *)((long)&local_110 + lVar9 + 4);
                    fVar3 = *(float *)(local_108 + lVar9);
                    fVar5 = fVar2 * 0.47140452;
                    fVar6 = fVar3 * 0.33333334;
                    fVar2 = fVar2 * 0.23570226;
                    *(float *)&pMVar13->data = fVar1;
                    *(float *)((long)&pMVar13->data + 4) = fVar1 * -0.6666667 - (fVar5 + fVar6);
                    *(float *)&pMVar13->refcount = (fVar5 + fVar1 * -0.6666667) - fVar6;
                    *(float *)((long)&pMVar13->refcount + 4) = fVar2 + fVar1 * 0.16666667 + fVar6;
                    *(float *)&pMVar13->elemsize = (fVar1 * 0.16666667 - fVar2) + fVar6;
                    *(float *)((long)&pMVar13->elemsize + 4) = fVar3;
                    pMVar13 = (Mat *)&pMVar13->elempack;
                    lVar9 = lVar9 + 0xc;
                  } while (lVar9 != 0x50);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar10);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar11);
          }
          local_dc = local_98->w;
          local_f8 = local_98->elemsize;
          local_d8[0] = (float)local_98->h;
          local_f0[0] = (float)local_98->elempack;
          local_e8 = local_98->allocator;
          local_c8 = (long)(int)local_d8[0] * (long)local_dc;
          local_108._0_8_ =
               (long)local_98->data +
               local_f8 * local_c8 * (long)(iVar16 / (int)local_84) +
               local_98->cstep * local_90 * local_f8;
          stack0xffffffffffffff00 = (int *)0x0;
          local_e0 = 2;
          local_d8[1] = 1.4013e-45;
          local_d8[2] = 1.4013e-45;
          pack_A_tile(local_110,(Mat *)local_108,0x24,(int)uVar11,uVar10);
          iVar16 = iVar16 + local_84;
          uVar12 = local_a0;
        } while (iVar16 < (int)local_a0);
      }
      local_120 = local_120 + 1;
    } while (local_120 != _c);
  }
  piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 36;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd43_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}